

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::declareBlock
          (TParseContext *this,TSourceLoc *loc,TTypeList *typeList,TString *instanceName,
          TArraySizes *arraySizes)

{
  TQualifier *qualifier;
  TVector<glslang::TArraySize> *pTVar1;
  TSymbolTable *pTVar2;
  TArraySizes *pTVar3;
  bool bVar4;
  byte bVar5;
  bool memberWithoutLocation;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  undefined4 extraout_var_01;
  TSpirvDecorate *pTVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  ulong uVar11;
  pointer pTVar12;
  TVariable *pTVar13;
  TSymbol *pTVar14;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TType *pTVar15;
  TTypeList *pTVar16;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  bool bVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  pointer pTVar21;
  TString *identifier;
  pointer pcVar22;
  uint uVar23;
  char *pcVar24;
  TQualifier *pTVar25;
  size_t sVar26;
  TParseContext *pTVar27;
  TParseContext *this_00;
  char *pcVar28;
  _func_int **pp_Var29;
  uint uVar30;
  TSourceLoc *pTVar31;
  byte bVar32;
  TQualifier defaultQualification;
  TType blockType;
  TType blockNameType;
  TQualifier *pTVar8;
  
  bVar32 = 0;
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == true)) {
    blockStorageRemap(this,loc,this->blockName,&this->currentBlockQualifier);
  }
  qualifier = &this->currentBlockQualifier;
  blockStageIoCheck(this,loc,qualifier);
  pTVar27 = this;
  blockQualifierCheck(this,loc,qualifier,false);
  if (arraySizes != (TArraySizes *)0x0) {
    arraySizesCheck(this,loc,qualifier,arraySizes,(TIntermTyped *)0x0,false);
    pTVar27 = this;
    arrayOfArrayVersionCheck(this,loc,arraySizes);
    pTVar1 = (arraySizes->sizes).sizes;
    if ((pTVar1 != (TVector<glslang::TArraySize> *)0x0) &&
       (1 < (int)((ulong)((long)(pTVar1->
                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ).
                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar1->
                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ).
                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4))) {
      pTVar27 = this;
      TParseVersions::requireProfile((TParseVersions *)this,loc,-9,"array-of-array of block");
    }
  }
  uVar30 = 0;
  while( true ) {
    uVar11 = (ulong)uVar30;
    pTVar12 = (typeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(typeList->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5) <= uVar11)
    break;
    pTVar27 = (TParseContext *)pTVar12[uVar11].type;
    iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])
                      (pTVar27);
    pTVar8 = (TQualifier *)CONCAT44(extraout_var,iVar6);
    pTVar31 = &(typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11].loc;
    uVar9 = *(ulong *)&pTVar8->field_0x8;
    uVar23 = (uint)uVar9 & 0x7f;
    uVar7 = (uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8;
    if (uVar23 != (uVar7 & 0x7f) && 1 < uVar23) {
      iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[6])
                        (pTVar27);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member storage qualifier cannot contradict block storage qualifier",
                 *(undefined8 *)(CONCAT44(extraout_var_00,iVar6) + 8));
      uVar7 = (uint)*(undefined8 *)&(this->currentBlockQualifier).field_0x8;
      uVar9 = *(ulong *)&pTVar8->field_0x8;
    }
    *(ulong *)&pTVar8->field_0x8 = uVar9 & 0xffffffffffffff80 | (ulong)(uVar7 & 0x7f);
    this_00 = this;
    globalQualifierFixCheck(this,pTVar31,pTVar8,false,(TPublicType *)0x0);
    inheritMemoryQualifiers(this_00,qualifier,pTVar8);
    uVar18 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
    uVar9 = *(ulong *)&pTVar8->field_0x8;
    if ((uVar18 & 0x20000000000) != 0) {
      uVar9 = uVar9 | 0x20000000000;
      *(ulong *)&pTVar8->field_0x8 = uVar9;
      uVar18 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
    }
    if ((uVar18 & 0x40000000000) != 0) {
      uVar9 = uVar9 | 0x40000000000;
      *(ulong *)&pTVar8->field_0x8 = uVar9;
      uVar18 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
    }
    if ((uVar18 & 0x80000000000) != 0) {
      uVar9 = uVar9 | 0x80000000000;
      *(ulong *)&pTVar8->field_0x8 = uVar9;
      uVar18 = *(ulong *)&(this->currentBlockQualifier).field_0x8;
    }
    if (((uint)uVar18 & 0x7f) == 0xf) {
      uVar9 = uVar9 & 0xffffffffffffff80 | 0xf;
      *(ulong *)&pTVar8->field_0x8 = uVar9;
    }
    if (((uint)uVar9 & 0x7f) == 8) {
      iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[6])
                        (pTVar27);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member cannot have a spirv_storage_class qualifier",
                 *(undefined8 *)(CONCAT44(extraout_var_01,iVar6) + 8));
    }
    if ((pTVar8->spirvDecorate != (TSpirvDecorate *)0x0) &&
       (pTVar10 = TQualifier::getSpirvDecorate(pTVar8),
       (pTVar10->decorateIds).
       super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[6])
                        (pTVar27);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member cannot have a spirv_decorate_id qualifier",
                 *(undefined8 *)(CONCAT44(extraout_var_02,iVar6) + 8));
    }
    if (((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) - 5 < 2) &&
       ((*(uint *)&pTVar8->field_0xa & 0x31e0e000) != 0)) {
      iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[6])
                        (pTVar27);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,
                 "member of uniform or buffer block cannot have an auxiliary or interpolation qualifier"
                 ,*(undefined8 *)(CONCAT44(extraout_var_03,iVar6) + 8));
    }
    iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1d])
                      (pTVar27);
    if ((char)iVar6 != '\0') {
      iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x14])
                        (pTVar27);
      arraySizesCheck(this,pTVar31,qualifier,(TArraySizes *)CONCAT44(extraout_var_04,iVar6),
                      (TIntermTyped *)0x0,
                      ((long)(typeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(typeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U == uVar11);
    }
    if ((pTVar8->layoutOffset != -1) &&
       ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0)) {
      TParseVersions::profileRequires
                ((TParseVersions *)this,pTVar31,-9,0x1b8,"GL_ARB_enhanced_layouts",
                 "\"offset\" on block member");
      TParseVersions::profileRequires
                ((TParseVersions *)this,pTVar31,8,300,"GL_ARB_enhanced_layouts",
                 "\"offset\" on block member");
    }
    iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x36])
                      (pTVar27);
    if ((char)iVar6 != '\0') {
      iVar6 = (*(pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x37])
                        (pTVar27);
      if (((char)iVar6 == '\0') ||
         (iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                            (this,"GL_ARB_bindless_texture"), (char)iVar6 == '\0')) {
        iVar6 = (*((typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,pTVar31,
                   "member of block cannot be or contain a sampler, image, or atomic_uint type",
                   *(undefined8 *)(CONCAT44(extraout_var_05,iVar6) + 8));
      }
      else {
        updateBindlessQualifier(this,(TType *)pTVar27);
      }
    }
    bVar4 = TType::
            contains<glslang::TType::containsCoopMat()const::_lambda(glslang::TType_const*)_1_>
                      ((TType *)pTVar27);
    if (bVar4) {
      iVar6 = (*((typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member of block cannot be or contain a cooperative matrix type",
                 *(undefined8 *)(CONCAT44(extraout_var_06,iVar6) + 8));
    }
    bVar4 = TType::
            contains<glslang::TType::containsCoopVec()const::_lambda(glslang::TType_const*)_1_>();
    if (bVar4) {
      iVar6 = (*((typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
      pTVar27 = this;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member of block cannot be or contain a cooperative vector type",
                 *(undefined8 *)(CONCAT44(extraout_var_07,iVar6) + 8));
    }
    uVar30 = uVar30 + 1;
  }
  pTVar2 = (this->super_TParseContextBase).symbolTable;
  if ((3 < (int)((ulong)((long)(pTVar2->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar2->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
     (bVar4 = builtInName(pTVar27,this->blockName), bVar4)) {
    redeclareBuiltinBlock(this,loc,typeList,this->blockName,instanceName,arraySizes);
    return;
  }
  reservedErrorCheck(this,loc,this->blockName);
  if (instanceName != (TString *)0x0) {
    reservedErrorCheck(this,loc,instanceName);
  }
  uVar30 = 0;
  while( true ) {
    pTVar12 = (typeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(typeList->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5) <=
        (ulong)uVar30) break;
    pTVar12 = pTVar12 + uVar30;
    iVar6 = (*pTVar12->type->_vptr_TType[6])();
    reservedErrorCheck(this,&pTVar12->loc,(TString *)CONCAT44(extraout_var_08,iVar6));
    uVar30 = uVar30 + 1;
  }
  switch(*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) {
  case 3:
    pTVar8 = &this->globalInputDefaults;
    break;
  case 4:
    pTVar8 = &this->globalOutputDefaults;
    break;
  case 5:
    pTVar8 = &this->globalUniformDefaults;
    break;
  case 6:
    pTVar8 = &this->globalBufferDefaults;
    break;
  case 7:
    pTVar8 = &this->globalSharedDefaults;
    break;
  default:
    pTVar27 = (TParseContext *)&defaultQualification;
    TQualifier::clear((TQualifier *)pTVar27);
    goto LAB_003afb3a;
  }
  pTVar27 = (TParseContext *)&defaultQualification;
  for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
    (pTVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions =
         (_func_int **)pTVar8->semanticName;
    pTVar8 = (TQualifier *)((long)pTVar8 + (ulong)bVar32 * -0x10 + 8);
    pTVar27 = (TParseContext *)((long)pTVar27 + (ulong)bVar32 * -0x10 + 8);
  }
LAB_003afb3a:
  if ((((this->currentBlockQualifier).layoutPushConstant == true) &&
      (bVar5 = (this->currentBlockQualifier).field_0x10, (bVar5 & 0xf) == 0)) ||
     (((this->currentBlockQualifier).layoutShaderRecord == true &&
      (bVar5 = (this->currentBlockQualifier).field_0x10, (bVar5 & 0xf) == 0)))) {
    (this->currentBlockQualifier).field_0x10 = bVar5 & 0xf0 | 3;
  }
  if (((*(ulong *)&(this->currentBlockQualifier).field_0x8 & 0x80000000000) != 0) &&
     (bVar5 = (this->currentBlockQualifier).field_0x10, (bVar5 & 0xf) == 0)) {
    (this->currentBlockQualifier).field_0x10 = bVar5 | 3;
  }
  mergeObjectLayoutQualifiers(pTVar27,&defaultQualification,qualifier,true);
  if (((this->currentBlockQualifier).layoutAlign != -1) &&
     ((5 < ((byte)defaultQualification._16_1_ & 0xf) ||
      ((0x2cU >> ((byte)defaultQualification._16_1_ & 0xf) & 1) == 0)))) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only be used with std140, std430, or scalar layout packing","align");
    defaultQualification.layoutAlign = -1;
  }
  uVar30 = 0;
  bVar17 = false;
  memberWithoutLocation = false;
  bVar4 = false;
  while( true ) {
    uVar11 = (ulong)uVar30;
    pTVar12 = (typeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(typeList->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar12 >> 5) <= uVar11)
    break;
    iVar6 = (*(pTVar12[uVar11].type)->_vptr_TType[10])();
    pTVar8 = (TQualifier *)CONCAT44(extraout_var_09,iVar6);
    pTVar31 = &(typeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar11].loc;
    if (((char)(*(ulong *)&pTVar8->field_0x1c >> 0x38) != -1) &&
       ((*(ulong *)&pTVar8->field_0x1c ^ defaultQualification._28_8_) >> 0x38 != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member cannot contradict block","stream");
    }
    uVar7 = (uint)*(undefined8 *)&pTVar8->field_0x24;
    if (((~uVar7 & 0xf) != 0) && (((uVar7 ^ defaultQualification._36_4_) & 0xf) != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member cannot contradict block (or what block inherited from global)"
                 ,"xfb_buffer");
    }
    if ((pTVar8->field_0x10 & 0xf) != 0) {
      iVar6 = (*((typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11].type)->_vptr_TType[6])();
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"member of block cannot have a packing layout qualifier",
                 *(undefined8 *)(CONCAT44(extraout_var_10,iVar6) + 8));
    }
    if ((~*(uint *)&pTVar8->field_0x1c & 0xfff) == 0) {
      memberWithoutLocation = true;
    }
    else if ((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) - 3 < 2) {
      TParseVersions::requireProfile((TParseVersions *)this,pTVar31,0xe,"location on block member");
      TParseVersions::profileRequires
                ((TParseVersions *)this,pTVar31,6,0x1b8,"GL_ARB_enhanced_layouts",
                 "location on block member");
      TParseVersions::profileRequires
                ((TParseVersions *)this,pTVar31,8,0x140,2,(char **)AEP_shader_io_blocks,
                 "location on block member");
      bVar4 = true;
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"can only use in an in/out block","location on block member");
    }
    if (((pTVar8->layoutAlign != -1) || (pTVar8->layoutOffset != -1)) &&
       ((5 < ((byte)defaultQualification._16_1_ & 0xf) ||
        ((0x2cU >> ((byte)defaultQualification._16_1_ & 0xf) & 1) == 0)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar31,"can only be used with std140, std430, or scalar layout packing",
                 "offset/align");
    }
    bVar17 = (bool)(bVar17 | (*(ulong *)&pTVar8->field_0x8 & 0x40000000000) != 0);
    lVar20 = 10;
    pTVar25 = &defaultQualification;
    pTVar15 = &blockType;
    for (lVar19 = lVar20; lVar19 != 0; lVar19 = lVar19 + -1) {
      pTVar15->_vptr_TType = (_func_int **)pTVar25->semanticName;
      pTVar25 = (TQualifier *)((long)pTVar25 + (ulong)bVar32 * -0x10 + 8);
      pTVar15 = (TType *)((long)pTVar15 + (ulong)bVar32 * -0x10 + 8);
    }
    mergeQualifiers(this,pTVar31,(TQualifier *)&blockType,pTVar8,false);
    pTVar15 = &blockType;
    for (; lVar20 != 0; lVar20 = lVar20 + -1) {
      pTVar8->semanticName = (char *)pTVar15->_vptr_TType;
      pTVar15 = (TType *)((long)pTVar15 + (ulong)bVar32 * -0x10 + 8);
      pTVar8 = (TQualifier *)((long)pTVar8 + (ulong)bVar32 * -0x10 + 8);
    }
    uVar30 = uVar30 + 1;
  }
  layoutMemberLocationArrayCheck(this,loc,bVar4,arraySizes);
  if ((((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 4) &&
      (uVar11 = (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf),
      uVar11 != 0xf)) &&
     (uVar9 = *(ulong *)&(this->currentBlockQualifier).field_0x24, uVar30 = ~(uint)uVar9,
     (uVar30 & 0x7ffc0000) != 0 && (uVar30 & 0xf) == 0)) {
    *(ulong *)&(this->currentBlockQualifier).field_0x24 = uVar9 & 0xfffffffffffffff0 | uVar11;
  }
  fixBlockLocations(this,loc,qualifier,typeList,bVar4,memberWithoutLocation);
  fixXfbOffsets(this,qualifier,typeList);
  fixBlockUniformOffsets(this,qualifier,typeList);
  uVar30 = 0;
  fixBlockUniformLayoutMatrix(this,qualifier,typeList,(TTypeList *)0x0);
  pTVar27 = this;
  fixBlockUniformLayoutPacking(this,qualifier,typeList,(TTypeList *)0x0);
  while( true ) {
    pTVar12 = (typeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar21 = (typeList->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pTVar21 - (long)pTVar12 >> 5) <= (ulong)uVar30) break;
    pTVar27 = this;
    layoutTypeCheck(this,&pTVar12[uVar30].loc,pTVar12[uVar30].type);
    uVar30 = uVar30 + 1;
  }
  if (bVar17) {
    for (uVar30 = 0; (ulong)uVar30 < (ulong)((long)pTVar21 - (long)pTVar12 >> 5);
        uVar30 = uVar30 + 1) {
      pTVar27 = this;
      checkAndResizeMeshViewDim(this,&pTVar12[uVar30].loc,pTVar12[uVar30].type,true);
      pTVar12 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar21 = (typeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  mergeObjectLayoutQualifiers(pTVar27,qualifier,&defaultQualification,true);
  TType::TType(&blockType,typeList,this->blockName,qualifier);
  pTVar3 = arraySizes;
  if (arraySizes == (TArraySizes *)0x0) {
    identifier = instanceName;
    if (instanceName == (TString *)0x0) {
      identifier = this->blockName;
    }
    ioArrayCheck(this,loc,&blockType,identifier);
    pTVar3 = blockType.arraySizes;
  }
  blockType.arraySizes = pTVar3;
  if ((this->currentBlockQualifier).layoutBufferReference == true) {
    if ((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) != 6) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can only be used with buffer","buffer_reference");
    }
    sVar26 = 0x12;
    TType::TType(&blockNameType,EbtReference,&blockType,this->blockName);
    pTVar13 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,sVar26);
    TVariable::TVariable(pTVar13,this->blockName,&blockNameType,true);
    bVar4 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar13);
    if (!bVar4) {
      pTVar14 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,this->blockName,
                                   (bool *)0x0,(bool *)0x0,(int *)0x0);
      iVar6 = (*pTVar14->_vptr_TSymbol[0xc])(pTVar14);
      iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x38))
                        ((long *)CONCAT44(extraout_var_11,iVar6));
      if (iVar6 == 0x12) {
        iVar6 = (*pTVar14->_vptr_TSymbol[0xc])(pTVar14);
        pTVar15 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 0xa8))
                                     ((long *)CONCAT44(extraout_var_12,iVar6));
        pTVar16 = TType::getStruct(pTVar15);
        if (pTVar16 != (TTypeList *)0x0) {
          iVar6 = (*pTVar14->_vptr_TSymbol[0xc])(pTVar14);
          pTVar15 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_13,iVar6) + 0xa8))
                                       ((long *)CONCAT44(extraout_var_13,iVar6));
          pTVar16 = TType::getStruct(pTVar15);
          if ((pTVar16->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              (pTVar16->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            iVar6 = (*pTVar14->_vptr_TSymbol[0xc])(pTVar14);
            lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar6) + 0x58))
                               ((long *)CONCAT44(extraout_var_14,iVar6));
            if (((blockType.qualifier._8_4_ ^ *(uint *)(lVar20 + 8)) & 0x7f) == 0) {
              iVar6 = (*pTVar14->_vptr_TSymbol[0xc])(pTVar14);
              pTVar15 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_19,iVar6) + 0xa8))
                                           ((long *)CONCAT44(extraout_var_19,iVar6));
              pTVar13 = (TVariable *)&blockType;
              TType::deepCopy(pTVar15,(TType *)pTVar13);
              goto LAB_003b0227;
            }
          }
        }
      }
      pTVar13 = (TVariable *)loc;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"block name cannot be redefined",(this->blockName->_M_dataplus)._M_p,"");
    }
LAB_003b0227:
    if (instanceName == (TString *)0x0) {
      return;
    }
LAB_003b030e:
    pTVar13 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)pTVar13);
    TVariable::TVariable(pTVar13,instanceName,&blockType,false);
    bVar4 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar13);
    if (bVar4) {
      layoutObjectCheck(this,loc,(TSymbol *)pTVar13);
      bVar4 = isIoResizeArray(this,&blockType);
      if (bVar4) {
        blockNameType._vptr_TType = (_func_int **)pTVar13;
        std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>::
        emplace_back<glslang::TSymbol*>
                  ((vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>> *)
                   &this->ioArraySymbolResizeList,(TSymbol **)&blockNameType);
        checkIoArraysConsistency(this,loc,true);
      }
      else {
        iVar6 = (*(pTVar13->super_TSymbol)._vptr_TSymbol[0xd])(pTVar13);
        fixIoArraySize(this,loc,(TType *)CONCAT44(extraout_var_17,iVar6));
      }
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,pTVar13);
      return;
    }
    bVar4 = std::operator==(instanceName,"");
    if (bVar4) {
      pcVar22 = (this->blockName->_M_dataplus)._M_p;
      pp_Var29 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar24 = "nameless block contains a member that already has a name at global scope";
    }
    else {
      iVar6 = (*(pTVar13->super_TSymbol)._vptr_TSymbol[3])(pTVar13);
      pcVar22 = *(pointer *)(CONCAT44(extraout_var_18,iVar6) + 8);
      pp_Var29 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar24 = "block instance name redefinition";
    }
  }
  else {
    sVar26 = 0x10;
    TType::TType(&blockNameType,EbtBlock,blockType.qualifier._8_4_ & 0x7f,1,0,0,false);
    pTVar13 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,sVar26);
    TVariable::TVariable(pTVar13,this->blockName,&blockNameType,false);
    bVar4 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)pTVar13);
    if (bVar4) {
LAB_003b02fa:
      if (instanceName == (TString *)0x0) {
        instanceName = NewPoolTString_abi_cxx11_("");
      }
      goto LAB_003b030e;
    }
    pTVar13 = (TVariable *)this->blockName;
    pTVar14 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,(TString *)pTVar13,
                                 (bool *)0x0,(bool *)0x0,(int *)0x0);
    iVar6 = (*pTVar14->_vptr_TSymbol[0xc])(pTVar14);
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar6) + 0x38))
                      ((long *)CONCAT44(extraout_var_15,iVar6));
    if (iVar6 == 0x10) {
      iVar6 = (*pTVar14->_vptr_TSymbol[0xc])(pTVar14);
      lVar20 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_16,iVar6));
      if (((blockType.qualifier._8_4_ ^ *(uint *)(lVar20 + 8)) & 0x7f) == 0) {
        pcVar22 = (this->blockName->_M_dataplus)._M_p;
        pcVar28 = TType::getStorageQualifierString(&blockType);
        pp_Var29 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar24 = "Cannot reuse block name within the same interface:";
        goto LAB_003b044e;
      }
      goto LAB_003b02fa;
    }
    pcVar22 = (this->blockName->_M_dataplus)._M_p;
    pp_Var29 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar24 = "block name cannot redefine a non-block name";
  }
  pcVar28 = "";
LAB_003b044e:
  (*pp_Var29[0x2d])(this,loc,pcVar24,pcVar22,pcVar28);
  return;
}

Assistant:

void TParseContext::declareBlock(const TSourceLoc& loc, TTypeList& typeList, const TString* instanceName,
    TArraySizes* arraySizes)
{
    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed)
        blockStorageRemap(loc, blockName, currentBlockQualifier);
    blockStageIoCheck(loc, currentBlockQualifier);
    blockQualifierCheck(loc, currentBlockQualifier, instanceName != nullptr);
    if (arraySizes != nullptr) {
        arraySizesCheck(loc, currentBlockQualifier, arraySizes, nullptr, false);
        arrayOfArrayVersionCheck(loc, arraySizes);
        if (arraySizes->getNumDims() > 1)
            requireProfile(loc, ~EEsProfile, "array-of-array of block");
    }

    // Inherit and check member storage qualifiers WRT to the block-level qualifier.
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TType& memberType = *typeList[member].type;
        TQualifier& memberQualifier = memberType.getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.storage != EvqTemporary && memberQualifier.storage != EvqGlobal && memberQualifier.storage != currentBlockQualifier.storage)
            error(memberLoc, "member storage qualifier cannot contradict block storage qualifier", memberType.getFieldName().c_str(), "");
        memberQualifier.storage = currentBlockQualifier.storage;
        globalQualifierFixCheck(memberLoc, memberQualifier);
        inheritMemoryQualifiers(currentBlockQualifier, memberQualifier);
        if (currentBlockQualifier.perPrimitiveNV)
            memberQualifier.perPrimitiveNV = currentBlockQualifier.perPrimitiveNV;
        if (currentBlockQualifier.perViewNV)
            memberQualifier.perViewNV = currentBlockQualifier.perViewNV;
        if (currentBlockQualifier.perTaskNV)
            memberQualifier.perTaskNV = currentBlockQualifier.perTaskNV;
        if (currentBlockQualifier.storage == EvqtaskPayloadSharedEXT)
            memberQualifier.storage = EvqtaskPayloadSharedEXT;
        if (memberQualifier.storage == EvqSpirvStorageClass)
            error(memberLoc, "member cannot have a spirv_storage_class qualifier", memberType.getFieldName().c_str(), "");
        if (memberQualifier.hasSpirvDecorate() && !memberQualifier.getSpirvDecorate().decorateIds.empty())
            error(memberLoc, "member cannot have a spirv_decorate_id qualifier", memberType.getFieldName().c_str(), "");
        if ((currentBlockQualifier.storage == EvqUniform || currentBlockQualifier.storage == EvqBuffer) && (memberQualifier.isInterpolation() || memberQualifier.isAuxiliary()))
            error(memberLoc, "member of uniform or buffer block cannot have an auxiliary or interpolation qualifier", memberType.getFieldName().c_str(), "");
        if (memberType.isArray())
            arraySizesCheck(memberLoc, currentBlockQualifier, memberType.getArraySizes(), nullptr, member == typeList.size() - 1);
        if (memberQualifier.hasOffset()) {
            if (spvVersion.spv == 0) {
                profileRequires(memberLoc, ~EEsProfile, 440, E_GL_ARB_enhanced_layouts, "\"offset\" on block member");
                profileRequires(memberLoc, EEsProfile, 300, E_GL_ARB_enhanced_layouts, "\"offset\" on block member");
            }
        }

        // For bindless texture, sampler can be declared as uniform/storage block member,
        if (memberType.containsOpaque()) {
            if (memberType.containsSampler() && extensionTurnedOn(E_GL_ARB_bindless_texture))
                updateBindlessQualifier(memberType);
            else
                error(memberLoc, "member of block cannot be or contain a sampler, image, or atomic_uint type", typeList[member].type->getFieldName().c_str(), "");
            }

        if (memberType.containsCoopMat())
            error(memberLoc, "member of block cannot be or contain a cooperative matrix type", typeList[member].type->getFieldName().c_str(), "");

        if (memberType.containsCoopVec())
            error(memberLoc, "member of block cannot be or contain a cooperative vector type", typeList[member].type->getFieldName().c_str(), "");
    }

    // This might be a redeclaration of a built-in block.  If so, redeclareBuiltinBlock() will
    // do all the rest.
    if (! symbolTable.atBuiltInLevel() && builtInName(*blockName)) {
        redeclareBuiltinBlock(loc, typeList, *blockName, instanceName, arraySizes);
        return;
    }

    // Not a redeclaration of a built-in; check that all names are user names.
    reservedErrorCheck(loc, *blockName);
    if (instanceName)
        reservedErrorCheck(loc, *instanceName);
    for (unsigned int member = 0; member < typeList.size(); ++member)
        reservedErrorCheck(typeList[member].loc, typeList[member].type->getFieldName());

    // Make default block qualification, and adjust the member qualifications

    TQualifier defaultQualification;
    switch (currentBlockQualifier.storage) {
    case EvqUniform:    defaultQualification = globalUniformDefaults;    break;
    case EvqBuffer:     defaultQualification = globalBufferDefaults;     break;
    case EvqVaryingIn:  defaultQualification = globalInputDefaults;      break;
    case EvqVaryingOut: defaultQualification = globalOutputDefaults;     break;
    case EvqShared:     defaultQualification = globalSharedDefaults;     break;
    default:            defaultQualification.clear();                    break;
    }

    // Special case for "push_constant uniform", which has a default of std430,
    // contrary to normal uniform defaults, and can't have a default tracked for it.
    if ((currentBlockQualifier.isPushConstant() && !currentBlockQualifier.hasPacking()) ||
        (currentBlockQualifier.isShaderRecord() && !currentBlockQualifier.hasPacking()))
        currentBlockQualifier.layoutPacking = ElpStd430;

    // Special case for "taskNV in/out", which has a default of std430,
    if (currentBlockQualifier.isTaskMemory() && !currentBlockQualifier.hasPacking())
        currentBlockQualifier.layoutPacking = ElpStd430;

    // fix and check for member layout qualifiers

    mergeObjectLayoutQualifiers(defaultQualification, currentBlockQualifier, true);

    // "The align qualifier can only be used on blocks or block members, and only for blocks declared with std140 or std430 layouts."
    if (currentBlockQualifier.hasAlign()) {
        if (defaultQualification.layoutPacking != ElpStd140 &&
            defaultQualification.layoutPacking != ElpStd430 &&
            defaultQualification.layoutPacking != ElpScalar) {
            error(loc, "can only be used with std140, std430, or scalar layout packing", "align", "");
            defaultQualification.layoutAlign = -1;
        }
    }

    bool memberWithLocation = false;
    bool memberWithoutLocation = false;
    bool memberWithPerViewQualifier = false;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.hasStream()) {
            if (defaultQualification.layoutStream != memberQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block", "stream", "");
        }

        // "This includes a block's inheritance of the
        // current global default buffer, a block member's inheritance of the block's
        // buffer, and the requirement that any *xfb_buffer* declared on a block
        // member must match the buffer inherited from the block."
        if (memberQualifier.hasXfbBuffer()) {
            if (defaultQualification.layoutXfbBuffer != memberQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
        }

        if (memberQualifier.hasPacking())
            error(memberLoc, "member of block cannot have a packing layout qualifier", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.hasLocation()) {
            const char* feature = "location on block member";
            switch (currentBlockQualifier.storage) {
            case EvqVaryingIn:
            case EvqVaryingOut:
                requireProfile(memberLoc, ECoreProfile | ECompatibilityProfile | EEsProfile, feature);
                profileRequires(memberLoc, ECoreProfile | ECompatibilityProfile, 440, E_GL_ARB_enhanced_layouts, feature);
                profileRequires(memberLoc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, feature);
                memberWithLocation = true;
                break;
            default:
                error(memberLoc, "can only use in an in/out block", feature, "");
                break;
            }
        } else
            memberWithoutLocation = true;

        // "The offset qualifier can only be used on block members of blocks declared with std140 or std430 layouts."
        // "The align qualifier can only be used on blocks or block members, and only for blocks declared with std140 or std430 layouts."
        if (memberQualifier.hasAlign() || memberQualifier.hasOffset()) {
            if (defaultQualification.layoutPacking != ElpStd140 &&
                defaultQualification.layoutPacking != ElpStd430 &&
                defaultQualification.layoutPacking != ElpScalar)
                error(memberLoc, "can only be used with std140, std430, or scalar layout packing", "offset/align", "");
        }

        if (memberQualifier.isPerView()) {
            memberWithPerViewQualifier = true;
        }

        TQualifier newMemberQualification = defaultQualification;
        mergeQualifiers(memberLoc, newMemberQualification, memberQualifier, false);
        memberQualifier = newMemberQualification;
    }

    layoutMemberLocationArrayCheck(loc, memberWithLocation, arraySizes);

    // Ensure that the block has an XfbBuffer assigned. This is needed
    // because if the block has a XfbOffset assigned, then it is
    // assumed that it has implicitly assigned the current global
    // XfbBuffer, and because it's members need to be assigned a
    // XfbOffset if they lack it.
    if (currentBlockQualifier.storage == EvqVaryingOut && globalOutputDefaults.hasXfbBuffer()) {
       if (!currentBlockQualifier.hasXfbBuffer() && currentBlockQualifier.hasXfbOffset())
          currentBlockQualifier.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
    }

    // Process the members
    fixBlockLocations(loc, currentBlockQualifier, typeList, memberWithLocation, memberWithoutLocation);
    fixXfbOffsets(currentBlockQualifier, typeList);
    fixBlockUniformOffsets(currentBlockQualifier, typeList);
    fixBlockUniformLayoutMatrix(currentBlockQualifier, &typeList, nullptr);
    fixBlockUniformLayoutPacking(currentBlockQualifier, &typeList, nullptr);
    for (unsigned int member = 0; member < typeList.size(); ++member)
        layoutTypeCheck(typeList[member].loc, *typeList[member].type);

    if (memberWithPerViewQualifier) {
        for (unsigned int member = 0; member < typeList.size(); ++member) {
            checkAndResizeMeshViewDim(typeList[member].loc, *typeList[member].type, /*isBlockMember*/ true);
        }
    }

    // reverse merge, so that currentBlockQualifier now has all layout information
    // (can't use defaultQualification directly, it's missing other non-layout-default-class qualifiers)
    mergeObjectLayoutQualifiers(currentBlockQualifier, defaultQualification, true);

    //
    // Build and add the interface block as a new type named 'blockName'
    //

    TType blockType(&typeList, *blockName, currentBlockQualifier);
    if (arraySizes != nullptr)
        blockType.transferArraySizes(arraySizes);

    if (arraySizes == nullptr)
        ioArrayCheck(loc, blockType, instanceName ? *instanceName : *blockName);
    if (currentBlockQualifier.hasBufferReference()) {

        if (currentBlockQualifier.storage != EvqBuffer)
            error(loc, "can only be used with buffer", "buffer_reference", "");

        // Create the block reference type. If it was forward-declared, detect that
        // as a referent struct type with no members. Replace the referent type with
        // blockType.
        TType blockNameType(EbtReference, blockType, *blockName);
        TVariable* blockNameVar = new TVariable(blockName, blockNameType, true);
        if (! symbolTable.insert(*blockNameVar)) {
            TSymbol* existingName = symbolTable.find(*blockName);
            if (existingName->getType().isReference() &&
                existingName->getType().getReferentType()->getStruct() &&
                existingName->getType().getReferentType()->getStruct()->size() == 0 &&
                existingName->getType().getQualifier().storage == blockType.getQualifier().storage) {
                existingName->getType().getReferentType()->deepCopy(blockType);
            } else {
                error(loc, "block name cannot be redefined", blockName->c_str(), "");
            }
        }
        if (!instanceName) {
            return;
        }
    } else {
        //
        // Don't make a user-defined type out of block name; that will cause an error
        // if the same block name gets reused in a different interface.
        //
        // "Block names have no other use within a shader
        // beyond interface matching; it is a compile-time error to use a block name at global scope for anything
        // other than as a block name (e.g., use of a block name for a global variable name or function name is
        // currently reserved)."
        //
        // Use the symbol table to prevent normal reuse of the block's name, as a variable entry,
        // whose type is EbtBlock, but without all the structure; that will come from the type
        // the instances point to.
        //
        TType blockNameType(EbtBlock, blockType.getQualifier().storage);
        TVariable* blockNameVar = new TVariable(blockName, blockNameType);
        if (! symbolTable.insert(*blockNameVar)) {
            TSymbol* existingName = symbolTable.find(*blockName);
            if (existingName->getType().getBasicType() == EbtBlock) {
                if (existingName->getType().getQualifier().storage == blockType.getQualifier().storage) {
                    error(loc, "Cannot reuse block name within the same interface:", blockName->c_str(), blockType.getStorageQualifierString());
                    return;
                }
            } else {
                error(loc, "block name cannot redefine a non-block name", blockName->c_str(), "");
                return;
            }
        }
    }

    // Add the variable, as anonymous or named instanceName.
    // Make an anonymous variable if no name was provided.
    if (! instanceName)
        instanceName = NewPoolTString("");

    TVariable& variable = *new TVariable(instanceName, blockType);
    if (! symbolTable.insert(variable)) {
        if (*instanceName == "")
            error(loc, "nameless block contains a member that already has a name at global scope", blockName->c_str(), "");
        else
            error(loc, "block instance name redefinition", variable.getName().c_str(), "");

        return;
    }

    // Check for general layout qualifier errors
    layoutObjectCheck(loc, variable);

    // fix up
    if (isIoResizeArray(blockType)) {
        ioArraySymbolResizeList.push_back(&variable);
        checkIoArraysConsistency(loc, true);
    } else
        fixIoArraySize(loc, variable.getWritableType());

    // Save it in the AST for linker use.
    trackLinkage(variable);
}